

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall parser::Parser::expand(Parser *this)

{
  TokenType *this_00;
  _Elt_pointer ppVar1;
  TokenType TVar2;
  allocator<char> local_f1;
  string local_f0;
  Operator e;
  Operator local_78;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_f1);
  Operator::Operator(&local_78,NULLTOKEN,&local_f0);
  this_00 = &e.super_Token.Type;
  e.super_Token._vptr_Token._0_4_ = 0;
  Operator::Operator((Operator *)this_00,&local_78);
  std::deque<std::pair<int,Operator>,std::allocator<std::pair<int,Operator>>>::
  emplace_back<std::pair<int,Operator>>
            ((deque<std::pair<int,Operator>,std::allocator<std::pair<int,Operator>>> *)
             &this->Operators,(pair<int,_Operator> *)&e);
  Operator::~Operator((Operator *)this_00);
  Operator::~Operator(&local_78);
  std::__cxx11::string::~string((string *)&local_f0);
  produce(this);
  binary(&e,this,(this->peekToken).Type);
  while (e.super_Token.Type != ERROR) {
    nextToken(this);
    pushOperator(this,&e,true);
    nextToken(this);
    produce(this);
    binary(&local_78,this,(this->peekToken).Type);
    Operator::operator=(&e,&local_78);
    Operator::~Operator(&local_78);
  }
  while( true ) {
    ppVar1 = (this->Operators).c.
             super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar1 == (this->Operators).c.
                  super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      TVar2 = (this->Operators).c.
              super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1][4].second.super_Token.Type;
    }
    else {
      TVar2 = ppVar1[-1].second.super_Token.Type;
    }
    if ((TVar2 == ERROR) || (TVar2 == NULLTOKEN)) break;
    popOperator(this,true);
  }
  std::deque<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>::pop_back
            (&(this->Operators).c);
  Operator::~Operator(&e);
  return;
}

Assistant:

void Parser::expand()
{
    Operators.push({PRECENDENCE::BASE, Operator(TokenType::NULLTOKEN, "")});
    produce();
    auto e = binary(peekToken.Type);
    while(e.Type != TokenType::ERROR)
    {
        nextToken();
        pushOperator(e, true);
        nextToken();
        produce();
        e = binary(peekToken.Type);
    }
    while(Operators.top().second.Type != TokenType::ERROR &&
          Operators.top().second.Type != TokenType::NULLTOKEN)
    {
        popOperator(true);
    }
    Operators.pop();

}